

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int clearCellOverflow(MemPage *pPage,uchar *pCell,CellInfo *pInfo)

{
  BtShared *pBt;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int unaff_R15D;
  MemPage *pOvfl;
  Pgno iNext;
  MemPage *local_40;
  Pgno local_34;
  
  if (pPage->aDataEnd < pCell + pInfo->nSize) {
    unaff_R15D = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12e80,
                "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
  }
  else {
    uVar4 = *(uint *)(pCell + pInfo->nSize + -4);
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    pBt = pPage->pBt;
    uVar3 = pBt->usableSize - 4;
    uVar5 = (ulong)(~(uint)pInfo->nLocal + pInfo->nPayload + uVar3) / (ulong)uVar3;
    do {
      iVar2 = (int)uVar5;
      uVar3 = iVar2 - 1;
      uVar5 = (ulong)uVar3;
      if (iVar2 == 0) {
        return 0;
      }
      local_34 = 0;
      local_40 = (MemPage *)0x0;
      if ((uVar4 < 2) || (pBt->nPage < uVar4)) {
        bVar1 = false;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12e91,
                    "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
        unaff_R15D = 0xb;
      }
      else {
        if ((uVar3 == 0) || (iVar2 = getOverflowPage(pBt,uVar4,&local_40,&local_34), iVar2 == 0)) {
          if (((local_40 == (MemPage *)0x0) &&
              (local_40 = btreePageLookup(pBt,uVar4), local_40 == (MemPage *)0x0)) ||
             ((int)local_40->pDbPage->nRef == 1)) {
            iVar2 = freePage2(pBt,local_40,uVar4);
          }
          else {
            iVar2 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12ea5,
                        "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
          }
          if ((local_40 != (MemPage *)0x0) && (local_40->pDbPage != (DbPage *)0x0)) {
            sqlite3PagerUnrefNotNull(local_40->pDbPage);
          }
          if (iVar2 == 0) {
            bVar1 = true;
            uVar4 = local_34;
            goto LAB_0014b0cb;
          }
        }
        bVar1 = false;
        unaff_R15D = iVar2;
      }
LAB_0014b0cb:
    } while (bVar1);
  }
  return unaff_R15D;
}

Assistant:

static SQLITE_NOINLINE int clearCellOverflow(
  MemPage *pPage,          /* The page that contains the Cell */
  unsigned char *pCell,    /* First byte of the Cell */
  CellInfo *pInfo          /* Size information about the cell */
){
  BtShared *pBt;
  Pgno ovflPgno;
  int rc;
  int nOvfl;
  u32 ovflPageSize;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pInfo->nLocal!=pInfo->nPayload );
  testcase( pCell + pInfo->nSize == pPage->aDataEnd );
  testcase( pCell + (pInfo->nSize-1) == pPage->aDataEnd );
  if( pCell + pInfo->nSize > pPage->aDataEnd ){
    /* Cell extends past end of page */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  ovflPgno = get4byte(pCell + pInfo->nSize - 4);
  pBt = pPage->pBt;
  assert( pBt->usableSize > 4 );
  ovflPageSize = pBt->usableSize - 4;
  nOvfl = (pInfo->nPayload - pInfo->nLocal + ovflPageSize - 1)/ovflPageSize;
  assert( nOvfl>0 ||
    (CORRUPT_DB && (pInfo->nPayload + ovflPageSize)<ovflPageSize)
  );
  while( nOvfl-- ){
    Pgno iNext = 0;
    MemPage *pOvfl = 0;
    if( ovflPgno<2 || ovflPgno>btreePagecount(pBt) ){
      /* 0 is not a legal page number and page 1 cannot be an
      ** overflow page. Therefore if ovflPgno<2 or past the end of the
      ** file the database must be corrupt. */
      return SQLITE_CORRUPT_BKPT;
    }
    if( nOvfl ){
      rc = getOverflowPage(pBt, ovflPgno, &pOvfl, &iNext);
      if( rc ) return rc;
    }

    if( ( pOvfl || ((pOvfl = btreePageLookup(pBt, ovflPgno))!=0) )
     && sqlite3PagerPageRefcount(pOvfl->pDbPage)!=1
    ){
      /* There is no reason any cursor should have an outstanding reference
      ** to an overflow page belonging to a cell that is being deleted/updated.
      ** So if there exists more than one reference to this page, then it
      ** must not really be an overflow page and the database must be corrupt.
      ** It is helpful to detect this before calling freePage2(), as
      ** freePage2() may zero the page contents if secure-delete mode is
      ** enabled. If this 'overflow' page happens to be a page that the
      ** caller is iterating through or using in some other way, this
      ** can be problematic.
      */
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = freePage2(pBt, pOvfl, ovflPgno);
    }

    if( pOvfl ){
      sqlite3PagerUnref(pOvfl->pDbPage);
    }
    if( rc ) return rc;
    ovflPgno = iNext;
  }
  return SQLITE_OK;
}